

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O1

int __thiscall CDesign::GetRoutableLayer(CDesign *this,int iMode)

{
  long lVar1;
  
  lVar1 = 0xc90;
  if (iMode != 0x40) {
    if (iMode != 0x80) {
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x73d,"int CDesign::GetRoutableLayer(int)");
    }
    lVar1 = 0xc94;
  }
  return *(int *)((long)&(this->super_CObject)._vptr_CObject + lVar1);
}

Assistant:

int	CDesign::GetRoutableLayer(int iMode)
{
	switch(iMode){
	case GET_MODE_MAX:	return	m_iHighestRoutableLayer;
	case GET_MODE_MIN:	return	m_iLowestRoutableLayer;
	default:
		assert(FALSE);
		break;
	}

	return	-1;
}